

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O3

DomSetType * __thiscall
dg::llvmdg::PostDominanceFrontiers::calculate
          (PostDominanceFrontiers *this,PostDominatorTree *DT,DomTreeNode *Node)

{
  byte bVar1;
  DomTreeNodeBase<llvm::BasicBlock> *pDVar2;
  DomTreeNode *pDVar3;
  char cVar4;
  _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
  *this_00;
  DomSetType *pDVar5;
  _Rb_tree_node_base *p_Var6;
  DomTreeNode *__range2;
  long lVar7;
  const_iterator cVar8;
  BasicBlock *P;
  BasicBlock *BB;
  const_arg_type_t<llvm::BasicBlock_*> local_58;
  undefined8 *local_50;
  PostDominanceFrontiers *local_48;
  undefined8 *local_40;
  key_type local_38;
  
  local_38 = *(key_type *)Node;
  local_48 = this;
  this_00 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
             *)std::
               map<llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
               ::operator[](&this->frontiers,&local_38);
  if (*(int *)(DT + 8) != 0) {
    if (local_38 != (key_type)0x0) {
      for (lVar7 = *(long *)(local_38 + 8); lVar7 != 0; lVar7 = *(long *)(lVar7 + 8)) {
        bVar1 = *(byte *)(*(long *)(lVar7 + 0x18) + 0x10);
        if ((*(long *)(lVar7 + 0x18) != 0 && 0x1a < bVar1) && bVar1 - 0x1c < 0xb) {
          do {
            local_58 = *(const_arg_type_t<llvm::BasicBlock_*> *)(*(long *)(lVar7 + 0x18) + 0x28);
            cVar8 = llvm::
                    DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                    ::find((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                            *)(DT + 0x30),local_58);
            if (((cVar8.Ptr != (pointer)((ulong)*(uint *)(DT + 0x40) * 0x10 + *(long *)(DT + 0x30)))
                && (pDVar2 = ((cVar8.Ptr)->
                             super_pair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>
                             ).second._M_t.
                             super___uniq_ptr_impl<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                             .
                             super__Head_base<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_false>
                             ._M_head_impl, pDVar2 != (DomTreeNodeBase<llvm::BasicBlock> *)0x0)) &&
               (*(DomTreeNode **)(pDVar2 + 8) != Node)) {
              std::
              _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
              ::_M_insert_unique<llvm::BasicBlock*const&>(this_00,&local_58);
            }
            do {
              lVar7 = *(long *)(lVar7 + 8);
              if (lVar7 == 0) goto LAB_0013bb3c;
              bVar1 = *(byte *)(*(long *)(lVar7 + 0x18) + 0x10);
            } while ((*(long *)(lVar7 + 0x18) == 0 || bVar1 < 0x1b) || 10 < bVar1 - 0x1c);
          } while( true );
        }
      }
    }
LAB_0013bb3c:
    if ((ulong)*(uint *)(Node + 0x20) != 0) {
      local_40 = *(undefined8 **)(Node + 0x18);
      local_50 = local_40 + *(uint *)(Node + 0x20);
      do {
        pDVar5 = calculate(local_48,DT,(DomTreeNode *)*local_40);
        for (p_Var6 = (pDVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(pDVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_58 = *(const_arg_type_t<llvm::BasicBlock_*> *)(p_Var6 + 1);
          cVar8 = llvm::
                  DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                  ::find((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                          *)(DT + 0x30),local_58);
          if (((cVar8.Ptr == (pointer)((ulong)*(uint *)(DT + 0x40) * 0x10 + *(long *)(DT + 0x30)))
              || (pDVar3 = ((cVar8.Ptr)->
                           super_pair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>
                           ).second._M_t.
                           super___uniq_ptr_impl<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                           .super__Head_base<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_false>.
                           _M_head_impl, pDVar3 == Node || pDVar3 == (DomTreeNode *)0x0)) ||
             (cVar4 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::dominates
                                ((DomTreeNodeBase *)DT,(DomTreeNodeBase *)Node), cVar4 == '\0')) {
            std::
            _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
            ::_M_insert_unique<llvm::BasicBlock*const&>(this_00,&local_58);
          }
        }
        local_40 = local_40 + 1;
      } while (local_40 != local_50);
    }
  }
  return (DomSetType *)this_00;
}

Assistant:

DomSetType &calculate(const llvm::PostDominatorTree &DT,
                          const llvm::DomTreeNode *Node) {
        llvm::BasicBlock *BB = Node->getBlock();
        auto &S = frontiers[BB];

#if LLVM_VERSION_MAJOR >= 11
        bool empty_roots = DT.root_size() == 0;
#else
        bool empty_roots = DT.getRoots().empty();
#endif
        if (empty_roots)
            return S;

        // calculate DFlocal[Node]
        if (BB) {
            for (auto *P : predecessors(BB)) {
                // Does Node immediately dominate this predecessor?
                auto *SINode = DT[P];
                if (SINode && SINode->getIDom() != Node)
                    S.insert(P);
            }
        }

        // At this point, S is DFlocal.  Now we union in DFup's of our children.
        // Loop through and visit the nodes that Node immediately dominates
        // (Node's children in the IDomTree)
        for (auto *IDominee : *Node) {
            const auto &ChildDF = calculate(DT, IDominee);

            for (auto *cdfi : ChildDF) {
                if (!DT.properlyDominates(Node, DT[cdfi]))
                    S.insert(cdfi);
            }
        }

        return S;
    }